

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

mat4 * polyscope::view::getCameraPerspectiveMatrix(void)

{
  mat<4,_4,_float,_(glm::qualifier)0> *in_RDI;
  double dVar1;
  double horiz;
  double vert;
  double aspectRatio;
  double fovRad;
  double nearClip;
  double farClip;
  mat<4,_4,_float,_(glm::qualifier)0> *this;
  int iVar2;
  uint in_stack_fffffffffffffecc;
  double in_stack_fffffffffffffed0;
  mat<4,_4,_double,_(glm::qualifier)0> *in_stack_fffffffffffffed8;
  mat<4,_4,_float,_(glm::qualifier)0> *in_stack_fffffffffffffee0;
  
  this = in_RDI;
  dVar1 = glm::radians<double>(fov);
  if (projectionMode == 0) {
    glm::perspective<double>
              (in_stack_fffffffffffffed0,(double)((ulong)in_stack_fffffffffffffecc << 0x20),
               (double)this,(double)in_RDI);
    glm::mat<4,4,float,(glm::qualifier)0>::mat<double,(glm::qualifier)0>
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  else if (projectionMode == 1) {
    iVar2 = projectionMode;
    tan(dVar1 / 2.0);
    glm::ortho<double>((double)in_stack_fffffffffffffee0,(double)in_stack_fffffffffffffed8,
                       in_stack_fffffffffffffed0,(double)CONCAT44(in_stack_fffffffffffffecc,iVar2),
                       (double)this,(double)in_RDI);
    glm::mat<4,4,float,(glm::qualifier)0>::mat<double,(glm::qualifier)0>
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  else {
    glm::mat<4,_4,_float,_(glm::qualifier)0>::mat(this,(float *)in_RDI);
  }
  return this;
}

Assistant:

glm::mat4 getCameraPerspectiveMatrix() {
  double farClip = farClipRatio * state::lengthScale;
  double nearClip = nearClipRatio * state::lengthScale;
  double fovRad = glm::radians(fov);
  double aspectRatio = (float)bufferWidth / bufferHeight;
  switch (projectionMode) {
  case ProjectionMode::Perspective: {
    return glm::perspective(fovRad, aspectRatio, nearClip, farClip);
    break;
  }
  case ProjectionMode::Orthographic: {
    double vert = tan(fovRad / 2.) * state::lengthScale * 2.;
    double horiz = vert * aspectRatio;
    return glm::ortho(-horiz, horiz, -vert, vert, nearClip, farClip);
    break;
  }
  }
  return glm::mat4(1.0f); // unreachable
}